

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void MeCab::uitoa<unsigned_int>(uint val,char *s)

{
  char *__last;
  char *in_RSI;
  uint in_EDI;
  uint mod;
  char *t;
  char *pcVar1;
  uint local_4;
  
  pcVar1 = in_RSI;
  for (local_4 = in_EDI; local_4 != 0; local_4 = local_4 / 10) {
    *pcVar1 = (char)(local_4 % 10) + '0';
    pcVar1 = pcVar1 + 1;
  }
  __last = pcVar1;
  if (in_RSI == pcVar1) {
    __last = pcVar1 + 1;
    *pcVar1 = '0';
  }
  *__last = '\0';
  std::reverse<char*>(in_RSI,__last);
  return;
}

Assistant:

inline void uitoa(T val, char *s) {
  char *t;
  T mod;
  t = s;
  while (val) {
    mod = val % 10;
    *t++ = static_cast<char>(mod) + '0';
    val /= 10;
  }

  if (s == t) *t++ = '0';
  *t = '\0';
  std::reverse(s, t);
  return;
}